

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O3

void __thiscall ExchangeCompilation_Empty_Test::TestBody(ExchangeCompilation_Empty_Test *this)

{
  compilation *pcVar1;
  uint generation;
  mapped_type *pmVar2;
  string *psVar3;
  parser<pstore::exchange::import_ns::callbacks> *ppVar4;
  ostream *poVar5;
  database *pdVar6;
  _func_int **message;
  char *expected_predicate_value;
  pointer *__ptr;
  char *pcVar7;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  mock_mutex mutex_1;
  shared_ptr<const_pstore::repo::compilation> imported_compilation;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  mock_mutex mutex;
  array<const_char_*,_1UL> names;
  char *triple;
  digest compilation_digest;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  string_mapping exported_names;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  ostringstream exported_compilation_stream;
  ostringstream exported_names_stream;
  string_mapping imported_names;
  undefined1 local_478 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_468;
  char local_459;
  undefined1 local_458 [8];
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  string local_438;
  AssertHelper local_418;
  element_type *local_410;
  undefined1 local_408 [8];
  database *local_400;
  AssertHelper local_3d0;
  undefined1 local_3c8 [8];
  index_pointer local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8 [4];
  index_pointer local_370;
  error_category *local_368;
  _Alloc_hider local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338 [5];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e0;
  char *local_2d8;
  char *local_2d0;
  _Alloc_hider local_2c8;
  size_type sStack_2c0;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [80];
  index_pointer local_260;
  error_category *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [5];
  _Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
  local_1d0;
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_190;
  ostringstream local_158;
  ostringstream local_108;
  extent<pstore::repo::compilation> local_b8;
  pointer local_a8;
  _List_node_base local_a0;
  size_t local_90;
  _List_node_base local_88;
  size_t local_78;
  __node_base_ptr *local_70;
  size_type local_68;
  __node_base local_60;
  size_type sStack_58;
  float local_50;
  size_t local_48;
  __node_base_ptr ap_Stack_40 [2];
  
  local_2d0 = "triple";
  local_2d8 = "triple";
  local_190._M_buckets = &local_190._M_single_bucket;
  local_190._M_bucket_count = 1;
  local_190._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_190._M_element_count = 0;
  local_190._M_rehash_policy._M_max_load_factor = 1.0;
  local_190._M_rehash_policy._M_next_resize = 0;
  local_190._M_single_bucket = (__node_base_ptr)0x0;
  pdVar6 = &(this->super_ExchangeCompilation).export_db_;
  out.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )0x0;
  out.container =
       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
        *)&local_190;
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (pdVar6,&local_2d8,&local_2d0,out);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)&local_1c8,pdVar6);
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_108.super_ostream_base,0x1000);
  local_108.str_._M_dataplus._M_p = (pointer)&local_108.str_.field_2;
  local_108.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_0023b498;
  local_108.str_._M_string_length = 0;
  local_108.str_.field_2._M_local_buf[0] = '\0';
  generation = pstore::database::get_current_revision(pdVar6);
  pcVar7 = "";
  local_2b8 = (undefined1  [8])(local_2b0 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"","");
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            (&local_108.super_ostream_base,(indent)0x0,pdVar6,generation,(string *)local_2b8,
             (string_mapping *)&local_1c8,false);
  if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
    operator_delete((void *)local_2b8,local_2b0._8_8_ + 1);
  }
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_158.super_ostream_base,0x1000);
  local_158.str_._M_dataplus._M_p = (pointer)&local_158.str_.field_2;
  local_158.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_0023b498;
  local_158.str_._M_string_length = 0;
  local_158.str_.field_2._M_local_buf[0] = '\0';
  local_3c8 = (undefined1  [8])local_408;
  local_3c0.addr_.a_._0_1_ = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_3c8);
  local_3c0.addr_.a_._0_1_ = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_2b8,pdVar6,(lock_type *)local_3c8);
  pcVar1 = (compilation *)(local_3c8 + 0x10);
  local_3c8 = (undefined1  [8])pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"triple","");
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_190,(key_type *)local_3c8);
  local_b8 = pstore::repo::compilation::
             alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                       ((transaction<std::unique_lock<mock_mutex>_> *)local_2b8,
                        (typed_address<pstore::indirect_string>)(pmVar2->a_).a_,
                        (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                         )0x0,(__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                               )0x0);
  if (local_3c8 != (undefined1  [8])pcVar1) {
    operator_delete((void *)local_3c8,local_3b8[0]._M_allocated_capacity + 1);
  }
  pstore::database::getro<pstore::repo::compilation,void>
            ((database *)local_3c8,(extent<pstore::repo::compilation> *)pdVar6);
  expected_predicate_value = (char *)0x0;
  pstore::exchange::export_ns::emit_compilation
            (&local_158.super_ostream_base,(indent)0x0,pdVar6,(compilation *)local_3c8,
             (string_mapping *)&local_1c8,false);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(local_3c0.addr_.a_._1_7_,local_3c0.addr_.a_._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_3c0.addr_.a_._1_7_,local_3c0.addr_.a_._0_1_));
  }
  pstore::transaction_base::commit((transaction_base *)local_2b8);
  local_2b8 = (undefined1  [8])&PTR__transaction_00234578;
  pstore::transaction_base::rollback((transaction_base *)local_2b8);
  local_2c8._M_p = (pointer)0x9abcdef0;
  sStack_2c0 = 0x12345678;
  local_a0._M_next = &local_a0;
  local_a8 = (pointer)0x0;
  local_b8 = (extent<pstore::repo::compilation>)ZEXT816(0);
  local_90 = 0;
  local_88._M_next = &local_88;
  local_78 = 0;
  local_70 = ap_Stack_40;
  local_68 = 1;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  sStack_58 = 0;
  local_50 = 1.0;
  local_48 = 0;
  ap_Stack_40[0] = (__node_base_ptr)0x0;
  local_2b8 = (undefined1  [8])&local_459;
  local_2b0[0] = '\0';
  local_a0._M_prev = local_a0._M_next;
  local_88._M_prev = local_88._M_next;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_2b8);
  pdVar6 = &(this->super_ExchangeCompilation).import_db_;
  local_2b0[0] = '\x01';
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_408,pdVar6,(lock_type *)local_2b8);
  anon_unknown.dwarf_a82ba::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_2b8,(transaction *)local_408,
             (string_mapping *)&local_b8);
  psVar3 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_108);
  ppVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)local_2b8,psVar3);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar4);
  local_458[0] = (internal)(local_260.addr_.a_._0_4_ == 0);
  local_450._M_head_impl = (array<pstore::sat_entry,_65536UL> *)0x0;
  if ((bool)local_458[0]) {
    pstore::index::
    get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
              ((index *)local_478,pdVar6,true);
    anon_unknown.dwarf_a82ba::import_compilation_parser
              ((parser<pstore::exchange::import_ns::callbacks> *)local_3c8,(transaction *)local_408,
               (string_mapping *)&local_b8,
               (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                *)local_478,(digest *)&local_2c8);
    psVar3 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_158);
    ppVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       ((parser<pstore::exchange::import_ns::callbacks> *)local_3c8,psVar3);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar4);
    local_418.data_._0_1_ = (internal)(local_370.addr_.a_._0_4_ == 0);
    local_410 = (element_type *)0x0;
    if ((bool)local_418.data_._0_1_) {
      pstore::transaction_base::commit((transaction_base *)local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_allocated_capacity != local_338) {
        operator_delete((void *)local_348._M_allocated_capacity,
                        local_338[0]._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_p);
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
      ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                *)(local_3c8 + 8));
      if (local_3c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_3c8,0x68);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != local_228) {
        operator_delete(local_238._M_p,local_228[0]._M_allocated_capacity + 1);
      }
      if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_pi);
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
      ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                *)local_2b0);
      if (local_2b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2b8,0x68);
      }
      local_408 = (undefined1  [8])&PTR__transaction_00234578;
      pstore::transaction_base::rollback((transaction_base *)local_408);
      pstore::index::
      get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)&local_438,pdVar6,true);
      pstore::index::
      hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
      ::find<pstore::uint128,void>
                ((const_iterator *)local_2b8,
                 (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                  *)CONCAT71(local_438._M_dataplus._M_p._1_7_,local_438._M_dataplus._M_p._0_1_),
                 pdVar6,(uint128 *)&local_2c8);
      memset(local_3c8 + 8,0,0xd8);
      local_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_3c8 = (undefined1  [8])pdVar6;
      testing::internal::
      CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
                ((internal *)local_408,"pos","compilation_index->end (import_db_)",
                 (iterator_base<true> *)local_2b8,(iterator_base<false> *)local_3c8);
      if (local_2e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        operator_delete(local_2e0._M_pi,0x20);
      }
      if (local_408[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_3c8 + 0x10),
                   "Compilation was not found in the index after import",0x33);
        if (local_400 != (database *)0x0) {
          pcVar7 = ((_Alloc_hider *)&local_400->_vptr_database)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_458,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                   ,0xc3,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_458,(Message *)local_3c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_458);
        if (local_3c8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_3c8 + 8))();
        }
        if (local_400 != (database *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_400,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_400);
        }
      }
      else {
        if (local_400 != (database *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_400,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_400);
        }
        pstore::index::
        hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
        ::iterator_base<true>::operator*((iterator_base<true> *)local_2b8);
        pstore::database::getro<pstore::repo::compilation,void>
                  ((database *)local_458,(extent<pstore::repo::compilation> *)pdVar6);
        pstore::indirect_string::read
                  ((int)local_408,pdVar6,*(size_t *)(CONCAT71(local_458._1_7_,local_458[0]) + 8));
        pstore::indirect_string::to_string_abi_cxx11_
                  ((string *)local_3c8,(indirect_string *)local_408);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                  ((internal *)local_478,"load_string (import_db_, imported_compilation->triple ())"
                   ,"triple",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                   &local_2d0);
        if (local_3c8 != (undefined1  [8])pcVar1) {
          operator_delete((void *)local_3c8,local_3b8[0]._M_allocated_capacity + 1);
        }
        if (local_478[0] == (index)0x0) {
          testing::Message::Message((Message *)local_3c8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470._M_pi
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message = (_func_int **)0x1e6b3f;
          }
          else {
            message = (_func_int **)
                      ((_Alloc_hider *)&(local_470._M_pi)->_vptr__Sp_counted_base)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_408,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                     ,0xc6,(char *)message);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_408,(Message *)local_3c8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_408);
          if (local_3c8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_3c8 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470._M_pi !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_470,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_470._M_pi);
        }
        local_408._0_4_ = *(undefined4 *)(CONCAT71(local_458._1_7_,local_458[0]) + 0x10);
        local_478._0_4_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_3c8,"imported_compilation->size ()","0U",(uint *)local_408,
                   (uint *)local_478);
        if (local_3c8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_408);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_408 + 0x10),
                     "The compilation should contain no definitions",0x2d);
          if ((undefined8 *)CONCAT71(local_3c0.addr_.a_._1_7_,local_3c0.addr_.a_._0_1_) ==
              (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)CONCAT71(local_3c0.addr_.a_._1_7_,local_3c0.addr_.a_._0_1_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_478,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                     ,199,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_478,(Message *)local_408)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_478);
          if (local_408 != (undefined1  [8])0x0) {
            (*(*(_func_int ***)local_408)[1])();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT71(local_3c0.addr_.a_._1_7_,local_3c0.addr_.a_._0_1_) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_3c8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT71(local_3c0.addr_.a_._1_7_,local_3c0.addr_.a_._0_1_));
        }
        if ((_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
             )local_450._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_450._M_head_impl);
        }
      }
      if ((tuple<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
           )local_1d0._M_head_impl !=
          (_Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
           )0x0) {
        operator_delete(local_1d0._M_head_impl,0x20);
      }
      if ((_Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
           )local_438._M_string_length != (factory *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length);
      }
      goto LAB_00136f15;
    }
    testing::Message::Message((Message *)&local_468);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_468._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)&local_368->field_0x0 + 0x20))
              (&local_438,local_368,local_370.addr_.a_._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_468._M_head_impl + 0x10),
               (char *)CONCAT71(local_438._M_dataplus._M_p._1_7_,local_438._M_dataplus._M_p._0_1_),
               local_438._M_string_length);
    local_458[0] = (internal)0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_468._M_head_impl + 0x10),local_458,1);
    local_458[0] = (internal)0x28;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_468._M_head_impl + 0x10),local_458,1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_458[0] = (internal)0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_458,1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_458[0] = (internal)0x29;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_458,1);
    local_458[0] = (internal)0xa;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_468._M_head_impl + 0x10),local_458,1);
    psVar3 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_158);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_468._M_head_impl + 0x10),(psVar3->_M_dataplus)._M_p,
               psVar3->_M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_458,(internal *)&local_418,
               (AssertionResult *)"compilation_parser.has_error ()","true","false",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0xb7,(char *)CONCAT71(local_458._1_7_,local_458[0]));
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_468);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_458._1_7_,local_458[0]) != &local_448) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_458._1_7_,local_458[0]),local_448._M_allocated_capacity + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_438._M_dataplus._M_p._1_7_,local_438._M_dataplus._M_p._0_1_) !=
        &local_438.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_438._M_dataplus._M_p._1_7_,local_438._M_dataplus._M_p._0_1_),
                      local_438.field_2._M_allocated_capacity + 1);
    }
    if (local_468._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_468._M_head_impl + 8))();
    }
    if (local_410 != (element_type *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_410,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_allocated_capacity != local_338) {
      operator_delete((void *)local_348._M_allocated_capacity,local_338[0]._M_allocated_capacity + 1
                     );
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_p);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)(local_3c8 + 8));
    if (local_3c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_3c8,0x68);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
    }
  }
  else {
    testing::Message::Message((Message *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_478._4_4_,local_478._0_4_) + 0x10),"JSON error was: ",0x10
              );
    (**(code **)(*(long *)local_258 + 0x20))(local_3c8,local_258,local_260.addr_.a_._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_478._4_4_,local_478._0_4_) + 0x10),(char *)local_3c8,
               CONCAT71(local_3c0.addr_.a_._1_7_,local_3c0.addr_.a_._0_1_));
    local_438._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_478._4_4_,local_478._0_4_) + 0x10),(char *)&local_438,1);
    local_438._M_dataplus._M_p._0_1_ = 0x28;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(CONCAT44(local_478._4_4_,local_478._0_4_) + 0x10),
                        (char *)&local_438,1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_438._M_dataplus._M_p._0_1_ = 0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_438,1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_438._M_dataplus._M_p._0_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_438,1);
    local_438._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_478._4_4_,local_478._0_4_) + 0x10),(char *)&local_438,1);
    psVar3 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_108);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_478._4_4_,local_478._0_4_) + 0x10),
               (psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_438,(internal *)local_458,(AssertionResult *)"name_parser.has_error ()","true"
               ,"false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0xad,(char *)CONCAT71(local_438._M_dataplus._M_p._1_7_,
                                      local_438._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=(&local_418,(Message *)local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_438._M_dataplus._M_p._1_7_,local_438._M_dataplus._M_p._0_1_) !=
        &local_438.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_438._M_dataplus._M_p._1_7_,local_438._M_dataplus._M_p._0_1_),
                      local_438.field_2._M_allocated_capacity + 1);
    }
    if (local_3c8 != (undefined1  [8])pcVar1) {
      operator_delete((void *)local_3c8,local_3b8[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_478._4_4_,local_478._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_478._4_4_,local_478._0_4_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_450,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_450._M_head_impl);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p != local_228) {
    operator_delete(local_238._M_p,local_228[0]._M_allocated_capacity + 1);
  }
  if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)local_2b0);
  if (local_2b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2b8,0x68);
  }
  local_408 = (undefined1  [8])&PTR__transaction_00234578;
  pstore::transaction_base::rollback((transaction_base *)local_408);
LAB_00136f15:
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)&local_b8);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_158);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_108);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1c8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_190);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, Empty) {
    using namespace pstore::exchange;
    static constexpr auto comments = false;
    static constexpr auto name_index = pstore::trailer::indices::name;

    constexpr auto * triple = "triple";
    std::array<pstore::gsl::czstring, 1> names{{triple}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<name_index> (export_db_, std::begin (names), std::end (names),
                                    std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<name_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                         export_db_.get_current_revision (), "", &exported_names,
                                         comments);

    export_ns::ostringstream exported_compilation_stream;
    {
        mock_mutex mutex;
        auto transaction = begin (export_db_, transaction_lock{mutex});
        std::vector<pstore::repo::definition> definitions;
        pstore::extent<pstore::repo::compilation> const compilation =
            pstore::repo::compilation::alloc (transaction, indir_strings[triple],
                                              std::begin (definitions), std::end (definitions));

        emit_compilation (exported_compilation_stream, export_ns::indent{}, export_db_,
                          *export_db_.getro (compilation), exported_names, comments);
        transaction.commit ();
    }



    constexpr pstore::index::digest compilation_digest{0x12345678, 0x9ABCDEF0};
    import_ns::string_mapping imported_names;
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        auto name_parser = import_strings_parser (&transaction, &imported_names);
        name_parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_names_stream.str ();

        auto const fragment_index =
            pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
        auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                             fragment_index, compilation_digest);
        compilation_parser.input (exported_compilation_stream.str ()).eof ();
        ASSERT_FALSE (compilation_parser.has_error ())
            << "JSON error was: " << compilation_parser.last_error ().message () << ' '
            << compilation_parser.coordinate () << '\n'
            << exported_compilation_stream.str ();

        transaction.commit ();
    }


    auto const compilation_index =
        pstore::index::get_index<pstore::trailer::indices::compilation> (import_db_);
    auto const pos = compilation_index->find (import_db_, compilation_digest);
    ASSERT_NE (pos, compilation_index->end (import_db_))
        << "Compilation was not found in the index after import";
    auto const imported_compilation = import_db_.getro (pos->second);
    EXPECT_EQ (load_string (import_db_, imported_compilation->triple ()), triple);
    ASSERT_EQ (imported_compilation->size (), 0U)
        << "The compilation should contain no definitions";
}